

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

char * archive_entry_acl_text(archive_entry *entry,wchar_t flags)

{
  char *pcVar1;
  wchar_t flags_00;
  
  free((entry->acl).acl_text);
  (entry->acl).acl_text = (char *)0x0;
  flags_00 = flags;
  if ((flags & 0x300U) != 0) {
    flags_00 = (uint)flags >> 10 & 3 | flags | 8;
  }
  if ((flags & 0x300U) != 0) {
    pcVar1 = archive_acl_to_text_l(&entry->acl,(ssize_t *)0x0,flags_00,(archive_string_conv *)0x0);
    (entry->acl).acl_text = pcVar1;
  }
  return (entry->acl).acl_text;
}

Assistant:

const char *
archive_entry_acl_text(struct archive_entry *entry, int flags)
{
	free(entry->acl.acl_text);
	entry->acl.acl_text = NULL;
	if (archive_entry_acl_text_compat(&flags) == 0)
		entry->acl.acl_text = archive_acl_to_text_l(&entry->acl, NULL,
		    flags, NULL);

	return (entry->acl.acl_text);
}